

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.h
# Opt level: O2

int UTF_uj16_cmpn(UTF_UC16 *uj16a,UTF_UC16 *uj16b,size_t len)

{
  UTF_UC16 UVar1;
  UTF_UC16 UVar2;
  uint uVar3;
  size_t sVar4;
  
  sVar4 = 0;
  uVar3 = 0xffffffff;
  while( true ) {
    UVar1 = uj16a[sVar4];
    UVar2 = uj16b[sVar4];
    if ((UVar1 == L'\0') || (UVar2 == L'\0')) {
      if ((ushort)UVar2 <= (ushort)UVar1) {
        uVar3 = (uint)((ushort)UVar2 < (ushort)UVar1);
      }
      return uVar3;
    }
    if (len == sVar4) {
      return 0;
    }
    if ((ushort)UVar1 < (ushort)UVar2) break;
    if ((ushort)UVar1 >= (ushort)UVar2 && UVar1 != UVar2) {
      return 1;
    }
    sVar4 = sVar4 + 1;
  }
  return -1;
}

Assistant:

static __inline int
UTF_uj16_cmpn(const UTF_UC16 *uj16a, const UTF_UC16 *uj16b, UTF_SIZE_T len)
{
    while (*uj16a && *uj16b)
    {
        if (len-- == 0) return 0;
        if (*uj16a < *uj16b) return -1;
        if (*uj16a > *uj16b) return 1;
        ++uj16a;
        ++uj16b;
    }
    if (*uj16a < *uj16b) return -1;
    if (*uj16a > *uj16b) return 1;
    return 0;
}